

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxy::IfcBuildingElementProxy
          (IfcBuildingElementProxy *this)

{
  *(undefined ***)&this->field_0x180 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x188 = 0;
  *(char **)&this->field_0x190 = "IfcBuildingElementProxy";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__0085b208);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x85b0d8;
  *(undefined8 *)&this->field_0x180 = 0x85b1f0;
  *(undefined8 *)&this->field_0x88 = 0x85b100;
  *(undefined8 *)&this->field_0x98 = 0x85b128;
  *(undefined8 *)&this->field_0xd0 = 0x85b150;
  *(undefined8 *)&this->field_0x100 = 0x85b178;
  *(undefined8 *)&this->field_0x138 = 0x85b1a0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x85b1c8;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).field_0x20
  ;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).field_0x18 = 0
  ;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).field_0x20 = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcBuildingElementProxy() : Object("IfcBuildingElementProxy") {}